

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall IsoWriter::writeDescriptors(IsoWriter *this)

{
  File *this_00;
  bool bVar1;
  size_t __n;
  long lVar2;
  size_t local_30;
  
  this->m_tagLocationBaseAddr = 0;
  this_00 = &this->m_file;
  File::seek(this_00,0x10000,smBegin);
  writePrimaryVolumeDescriptor(this);
  writeImpUseDescriptor(this);
  writePartitionDescriptor(this);
  writeLogicalVolumeDescriptor(this);
  writeUnallocatedSpaceDescriptor(this);
  writeTerminationDescriptor(this);
  File::seek(this_00,0x20000,smBegin);
  writeLogicalVolumeIntegrityDescriptor(this);
  writeTerminationDescriptor(this);
  File::seek(this_00,0x80000,smBegin);
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  lVar2 = (long)this->m_partitionEndAddress * 0x800;
  File::seek(this_00,lVar2 + 0xf800,smBegin);
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  writePrimaryVolumeDescriptor(this);
  writeImpUseDescriptor(this);
  writePartitionDescriptor(this);
  writeLogicalVolumeDescriptor(this);
  writeUnallocatedSpaceDescriptor(this);
  writeTerminationDescriptor(this);
  memset(this->m_buffer,0,0x800);
  bVar1 = File::size(this_00,(int64_t *)&local_30);
  __n = 0xffffffffffffffff;
  if (bVar1) {
    __n = local_30;
  }
  lVar2 = lVar2 + 0x8f800;
  if ((long)__n < lVar2) {
    do {
      File::write(this_00,(int)this->m_buffer,(void *)0x800,__n);
      bVar1 = File::size(this_00,(int64_t *)&local_30);
      __n = 0xffffffffffffffff;
      if (bVar1) {
        __n = local_30;
      }
    } while ((long)__n < lVar2);
  }
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  return;
}

Assistant:

void IsoWriter::writeDescriptors()
{
    m_tagLocationBaseAddr = 0;
    // descriptors in a beginning of a file
    m_file.seek(1024LL * 64);

    writePrimaryVolumeDescriptor();
    writeImpUseDescriptor();
    writePartitionDescriptor();
    writeLogicalVolumeDescriptor();
    writeUnallocatedSpaceDescriptor();
    writeTerminationDescriptor();

    m_file.seek(1024LL * 128);

    writeLogicalVolumeIntegrityDescriptor();
    writeTerminationDescriptor();

    m_file.seek(1024LL * 512);

    writeAnchorVolumeDescriptor(m_partitionEndAddress +
                                ALLOC_BLOCK_SIZE / SECTOR_SIZE);  // add space for last 64K anchor volume

    // descriptors in a end of a file

    const int64_t eofPos = m_partitionEndAddress * static_cast<int64_t>(SECTOR_SIZE);
    m_file.seek(eofPos + ALLOC_BLOCK_SIZE - SECTOR_SIZE);
    // TODO: It may be preferable not to include the AVDP at (N - 256) for Rewritable media (ditto DVDFab and ImgBurn)
    writeAnchorVolumeDescriptor(m_partitionEndAddress + ALLOC_BLOCK_SIZE / SECTOR_SIZE);

    writePrimaryVolumeDescriptor();
    writeImpUseDescriptor();
    writePartitionDescriptor();
    writeLogicalVolumeDescriptor();
    writeUnallocatedSpaceDescriptor();
    writeTerminationDescriptor();

    memset(m_buffer, 0, sizeof(m_buffer));
    const int64_t fullFileSize = eofPos + static_cast<int64_t>(1024 * 512) + ALLOC_BLOCK_SIZE;
    while (m_file.size() < fullFileSize - SECTOR_SIZE) m_file.write(m_buffer, SECTOR_SIZE);
    writeAnchorVolumeDescriptor(m_partitionEndAddress + ALLOC_BLOCK_SIZE / SECTOR_SIZE);
}